

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O1

void __thiscall
Diligent::TextureBase<Diligent::EngineVkImplTraits>::CreateView
          (TextureBase<Diligent::EngineVkImplTraits> *this,TextureViewDesc *ViewDesc,
          ITextureView **ppView)

{
  char (*in_R8) [56];
  string msg;
  string local_40;
  
  if (ViewDesc->ViewType == TEXTURE_VIEW_UNDEFINED) {
    FormatString<char[35]>(&local_40,(char (*) [35])"Texture view type is not specified");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x97);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  switch(ViewDesc->ViewType) {
  case TEXTURE_VIEW_SHADER_RESOURCE:
    if (((this->
         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
         ).m_Desc.BindFlags & BIND_SHADER_RESOURCE) != BIND_NONE) goto LAB_00249e44;
    FormatString<char[39],char_const*,char[55]>
              (&local_40,(Diligent *)"Attempting to create SRV for texture \'",
               (char (*) [39])
               &(this->
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ).m_Desc,(char **)"\' that was not created with BIND_SHADER_RESOURCE flag.",
               (char (*) [55])in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x99);
    break;
  case TEXTURE_VIEW_RENDER_TARGET:
    if (((this->
         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
         ).m_Desc.BindFlags & BIND_RENDER_TARGET) != BIND_NONE) goto LAB_00249e44;
    FormatString<char[39],char_const*,char[53]>
              (&local_40,(Diligent *)"Attempting to create RTV for texture \'",
               (char (*) [39])
               &(this->
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ).m_Desc,(char **)"\' that was not created with BIND_RENDER_TARGET flag.",
               (char (*) [53])in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x9d);
    break;
  case TEXTURE_VIEW_DEPTH_STENCIL:
  case TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL:
    if (((this->
         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
         ).m_Desc.BindFlags & BIND_DEPTH_STENCIL) != BIND_NONE) goto LAB_00249e44;
    FormatString<char[39],char_const*,char[53]>
              (&local_40,(Diligent *)"Attempting to create DSV for texture \'",
               (char (*) [39])
               &(this->
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ).m_Desc,(char **)"\' that was not created with BIND_DEPTH_STENCIL flag.",
               (char (*) [53])in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x9f);
    break;
  case TEXTURE_VIEW_UNORDERED_ACCESS:
    if (((this->
         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
         ).m_Desc.BindFlags & BIND_UNORDERED_ACCESS) != BIND_NONE) goto LAB_00249e44;
    FormatString<char[39],char_const*,char[56]>
              (&local_40,(Diligent *)"Attempting to create UAV for texture \'",
               (char (*) [39])
               &(this->
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ).m_Desc,(char **)"\' that was not created with BIND_UNORDERED_ACCESS flag.",in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x9b);
    break;
  default:
    FormatString<char[30]>(&local_40,(char (*) [30])"Unexpected texture view type.");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0xa1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
LAB_00249e44:
  (**(code **)((long)(this->
                     super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                     ).super_ObjectBase<Diligent::ITextureVk>.
                     super_RefCountedObject<Diligent::ITextureVk>.super_ITextureVk.super_ITexture.
                     super_IDeviceObject.super_IObject + 0x98))(this,ViewDesc,ppView,0);
  return;
}

Assistant:

CreateView(const struct TextureViewDesc& ViewDesc, ITextureView** ppView) override
    {
        DEV_CHECK_ERR(ViewDesc.ViewType != TEXTURE_VIEW_UNDEFINED, "Texture view type is not specified");
        if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_SHADER_RESOURCE, "Attempting to create SRV for texture '", this->m_Desc.Name, "' that was not created with BIND_SHADER_RESOURCE flag.");
        else if (ViewDesc.ViewType == TEXTURE_VIEW_UNORDERED_ACCESS)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS, "Attempting to create UAV for texture '", this->m_Desc.Name, "' that was not created with BIND_UNORDERED_ACCESS flag.");
        else if (ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_RENDER_TARGET, "Attempting to create RTV for texture '", this->m_Desc.Name, "' that was not created with BIND_RENDER_TARGET flag.");
        else if (ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_DEPTH_STENCIL, "Attempting to create DSV for texture '", this->m_Desc.Name, "' that was not created with BIND_DEPTH_STENCIL flag.");
        else
            UNEXPECTED("Unexpected texture view type.");

        CreateViewInternal(ViewDesc, ppView, false);
    }